

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<8192,Blob<256>>
               (hashfunc<Blob<256>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  size_type sVar3;
  undefined4 in_ECX;
  uint in_EDX;
  char *pcVar4;
  uint in_ESI;
  undefined4 in_R8D;
  byte in_R9B;
  bool result;
  Blob<256> h;
  keytype k;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> hashes;
  undefined1 local_454 [4];
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_stack_fffffffffffffbb0;
  Blob<8192> *in_stack_fffffffffffffbb8;
  uint8_t in_stack_fffffffffffffbc7;
  int in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbcc;
  pfHash in_stack_fffffffffffffbd0;
  undefined1 local_428 [211];
  uint8_t in_stack_fffffffffffffcab;
  uint8_t in_stack_fffffffffffffcac;
  uint8_t in_stack_fffffffffffffcad;
  uint8_t in_stack_fffffffffffffcae;
  uint8_t in_stack_fffffffffffffcaf;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_stack_fffffffffffffcb0;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = (byte)in_ECX & 1;
  local_f = (byte)in_R8D & 1;
  local_10 = in_R9B & 1;
  pcVar4 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar4 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x2000,pcVar4,(ulong)in_ESI);
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)0x199f5f);
  Blob<8192>::Blob((Blob<8192> *)local_428);
  memset(local_428,0,0x400);
  if ((local_d & 1) != 0) {
    Blob<256>::Blob((Blob<256> *)local_454);
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    (*p_Var2)(local_428,0x400,0,local_454);
    std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::push_back
              ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)CONCAT44(in_ESI,in_EDX),
               (value_type *)CONCAT44(in_ECX,in_R8D));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<8192>,Blob<256>>
            (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8,
             (bool)in_stack_fffffffffffffbc7,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  sVar3 = std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::size(&local_28);
  printf("%d keys\n",sVar3 & 0xffffffff);
  bVar1 = TestHashList<Blob<256>>
                    (in_stack_fffffffffffffcb0,(bool)in_stack_fffffffffffffcaf,
                     (bool)in_stack_fffffffffffffcae,(bool)in_stack_fffffffffffffcad,
                     (bool)in_stack_fffffffffffffcac,(bool)in_stack_fffffffffffffcab);
  printf("\n");
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::~vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)CONCAT44(in_ESI,in_EDX));
  return bVar1;
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}